

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

ostream * doctest::anon_unknown_14::operator<<(ostream *os,XmlEncode *xmlEncode)

{
  byte c;
  pointer pcVar1;
  byte bVar2;
  undefined8 in_RAX;
  uint uVar3;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  size_t n;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 uStack_38;
  
  uVar9 = (xmlEncode->m_str)._M_string_length;
  if (uVar9 != 0) {
    uVar8 = 0;
    uStack_38 = in_RAX;
    do {
      pcVar6 = (char *)((long)&uStack_38 + 4);
      pcVar1 = (xmlEncode->m_str)._M_dataplus._M_p;
      c = pcVar1[uVar8];
      if (c < 0x3c) {
        if (c == 0x22) {
          if (xmlEncode->m_forWhat == ForAttributes) {
            lVar5 = 6;
            pcVar6 = "&quot;";
          }
          else {
            uStack_38._0_5_ = CONCAT14(0x22,(undefined4)uStack_38);
            lVar5 = 1;
          }
          goto LAB_001180c6;
        }
        if (c == 0x26) {
          lVar5 = 5;
          pcVar6 = "&amp;";
          goto LAB_001180c6;
        }
LAB_00118045:
        if ((c < 9) || (c == 0x7f || (byte)(c - 0xe) < 0x12)) {
LAB_00118061:
          anon_unknown_35::hexEscapeChar(os,c);
        }
        else {
          if (c < 0x7f) {
            uStack_38._0_7_ = CONCAT16(c,(undefined6)uStack_38);
            lVar5 = 1;
            pcVar6 = (char *)((long)&uStack_38 + 6);
            goto LAB_001180c6;
          }
          if ((byte)(c + 8) < 200) goto LAB_00118061;
          if ((c & 0xe0) == 0xc0) {
            if (uVar8 + 1 < uVar9) {
              uVar3 = 0x1f;
              lVar5 = 2;
LAB_00118161:
              uVar3 = uVar3 & c;
              bVar2 = 1;
              lVar7 = 1;
              do {
                bVar2 = bVar2 & ((byte)pcVar1[lVar7 + uVar8] & 0xffffffc0) == 0x80;
                uVar4 = uVar3 << 6;
                uVar3 = (byte)pcVar1[lVar7 + uVar8] & 0x3f | uVar4;
                lVar7 = lVar7 + 1;
              } while (lVar5 != lVar7);
              if (((((bool)(bVar2 & 0x7f < uVar4)) && (((uint)lVar5 < 3 || (0x7ff < uVar4)))) &&
                  ((uint)lVar5 < 4 || 0xf7fe < uVar3 - 0x801)) &&
                 (lVar7 = lVar5, uVar9 = uVar8, uVar4 < 0x110000)) {
                do {
                  uStack_38 = CONCAT17((xmlEncode->m_str)._M_dataplus._M_p[uVar9],
                                       (undefined7)uStack_38);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (os,(char *)((long)&uStack_38 + 7),1);
                  uVar9 = uVar9 + 1;
                  lVar7 = lVar7 + -1;
                } while (lVar7 != 0);
                uVar8 = (uVar8 + lVar5) - 1;
              }
              else {
                anon_unknown_35::hexEscapeChar(os,c);
              }
              goto LAB_001180cb;
            }
          }
          else {
            uVar3 = c & 0xfffffff0;
            uVar10 = (ulong)(uVar3 != 0xe0);
            if (uVar8 + uVar10 + 2 < uVar9) {
              lVar5 = uVar10 + 3;
              uVar3 = (uint)(uVar3 == 0xe0) * 8 + 7;
              goto LAB_00118161;
            }
          }
          anon_unknown_35::hexEscapeChar(os,c);
        }
      }
      else {
        if (c == 0x3e) {
          if (((uVar8 < 3) || (pcVar1[uVar8 - 1] != ']')) || (pcVar1[uVar8 - 2] != ']')) {
            uStack_38._0_6_ = CONCAT15(0x3e,(undefined5)uStack_38);
            lVar5 = 1;
            pcVar6 = (char *)((long)&uStack_38 + 5);
          }
          else {
            lVar5 = 4;
            pcVar6 = "&gt;";
          }
        }
        else {
          if (c != 0x3c) goto LAB_00118045;
          lVar5 = 4;
          pcVar6 = "&lt;";
        }
LAB_001180c6:
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,lVar5);
      }
LAB_001180cb:
      uVar8 = uVar8 + 1;
      uVar9 = (xmlEncode->m_str)._M_string_length;
    } while (uVar8 < uVar9);
  }
  return os;
}

Assistant:

std::ostream& operator << ( std::ostream& os, XmlEncode const& xmlEncode ) {
        xmlEncode.encodeTo( os );
        return os;
    }